

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

void openjtalk_stop(OpenJTalk *oj)

{
  long in_RDI;
  unsigned_long in_stack_00000008;
  
  if (in_RDI == 0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else {
    g_psd->stop = true;
    do {
      sleep_internal(in_stack_00000008);
    } while ((g_psd->speaking & 1U) != 0);
    g_psd->stop = false;
    g_psd->counter = 0;
    g_psd->finished = true;
    g_psd->pause = false;
    g_psd->paused = false;
    if (g_psd->data != (short *)0x0) {
      free(g_psd->data);
      g_psd->data = (short *)0x0;
    }
  }
  return;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_stop(OpenJTalk *oj)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return;
	}

	g_psd->stop = true;
	do
	{
		sleep_internal(100);
	} while (g_psd->speaking);
	g_psd->stop = false;

	g_psd->counter = 0;
	g_psd->finished = true;
	g_psd->pause = false;
	g_psd->paused = false;

	if (g_psd->data)
	{
		free(g_psd->data);
		g_psd->data = NULL;
	}
}